

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

float __thiscall dynet::Trainer::clip_gradients(Trainer *this)

{
  uint uVar1;
  ostream *this_00;
  runtime_error *this_01;
  long in_RDI;
  ostringstream oss;
  float gg;
  float gscale;
  string local_1b8 [48];
  ostringstream local_188 [376];
  float local_10;
  float local_c;
  
  local_c = 1.0;
  if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
    local_10 = ParameterCollection::gradient_l2_norm((ParameterCollection *)0xdb1245);
    uVar1 = std::isnan((double)(ulong)(uint)local_10);
    if (((uVar1 & 1) != 0) || (uVar1 = std::isinf((double)(ulong)(uint)local_10), (uVar1 & 1) != 0))
    {
      std::__cxx11::ostringstream::ostringstream(local_188);
      this_00 = std::operator<<((ostream *)local_188,"Magnitude of gradient is bad: ");
      std::ostream::operator<<(this_00,local_10);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_01,local_1b8);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(float *)(in_RDI + 0x10) <= local_10 && local_10 != *(float *)(in_RDI + 0x10)) {
      *(float *)(in_RDI + 0x14) = *(float *)(in_RDI + 0x14) + 1.0;
      *(float *)(in_RDI + 0x1c) = *(float *)(in_RDI + 0x1c) + 1.0;
      local_c = *(float *)(in_RDI + 0x10) / local_10;
    }
  }
  return local_c;
}

Assistant:

float Trainer::clip_gradients() {
  float gscale = 1;
  if (clipping_enabled) {
    float gg = model->gradient_l2_norm();
    if (isnan(gg) || isinf(gg)) {
      ostringstream oss; oss << "Magnitude of gradient is bad: " << gg;
      throw std::runtime_error(oss.str());
    }
    if (gg > clip_threshold) {
      ++clips;
      ++clips_since_status;
      gscale = clip_threshold / gg;
    }
  }
  return gscale;
}